

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

void __thiscall mkvmuxer::VideoTrack::VideoTrack(VideoTrack *this,uint *seed)

{
  Track::Track(&this->super_Track,seed);
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__VideoTrack_0054a1a8;
  this->display_height_ = 0;
  this->display_width_ = 0;
  this->pixel_height_ = 0;
  this->pixel_width_ = 0;
  this->crop_left_ = 0;
  this->crop_right_ = 0;
  this->crop_top_ = 0;
  this->crop_bottom_ = 0;
  this->frame_rate_ = 0.0;
  this->height_ = 0;
  this->stereo_mode_ = 0;
  this->alpha_mode_ = 0;
  this->width_ = 0;
  this->colour_space_ = (char *)0x0;
  this->colour_ = (Colour *)0x0;
  this->projection_ = (Projection *)0x0;
  return;
}

Assistant:

VideoTrack::VideoTrack(unsigned int* seed)
    : Track(seed),
      display_height_(0),
      display_width_(0),
      pixel_height_(0),
      pixel_width_(0),
      crop_left_(0),
      crop_right_(0),
      crop_top_(0),
      crop_bottom_(0),
      frame_rate_(0.0),
      height_(0),
      stereo_mode_(0),
      alpha_mode_(0),
      width_(0),
      colour_space_(NULL),
      colour_(NULL),
      projection_(NULL) {}